

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O0

bool __thiscall flow::lang::Lexer::continueParseRegEx(Lexer *this,char delim)

{
  bool bVar1;
  int iVar2;
  bool local_2a;
  int local_20;
  int last;
  char delim_local;
  Lexer *this_local;
  
  local_20 = -1;
  std::__cxx11::string::clear();
  while( true ) {
    bVar1 = eof(this);
    local_2a = false;
    if (!bVar1) {
      iVar2 = currentChar(this);
      local_2a = iVar2 != delim || local_20 == 0x5c;
    }
    if (!local_2a) break;
    iVar2 = currentChar(this);
    std::__cxx11::string::operator+=((string *)&this->stringValue_,(char)iVar2);
    local_20 = currentChar(this);
    nextChar(this,true);
  }
  iVar2 = currentChar(this);
  if (iVar2 != delim) {
    this->token_ = Unknown;
  }
  else {
    nextChar(this,true);
    this->token_ = RegExp;
  }
  this_local._7_1_ = iVar2 == delim;
  return this_local._7_1_;
}

Assistant:

bool Lexer::continueParseRegEx(char delim) {
  int last = -1;

  stringValue_.clear();

  while (!eof() && (currentChar() != delim || (last == '\\'))) {
    stringValue_ += static_cast<char>(currentChar());
    last = currentChar();
    nextChar();
  }

  if (currentChar() == delim) {
    nextChar();
    token_ = Token::RegExp;
    return true;
  }

  token_ = Token::Unknown;
  return false;
}